

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestRunnerSystemSemaphore::TestRunnerSystemSemaphore(TestRunnerSystemSemaphore *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QNativeIpcKey local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->isAcquired)._M_base._M_i = false;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"androidtestrunner",0x11);
  QSystemSemaphore::platformSafeKey((QString *)&local_48,(Type)&local_60);
  QSystemSemaphore::QSystemSemaphore(&this->semaphore,&local_48,1,Open);
  QNativeIpcKey::~QNativeIpcKey(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestRunnerSystemSemaphore() { }